

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestring_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_a4ae0::CBSTest_ImplicitString_Test::TestBody(CBSTest_ImplicitString_Test *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  uint8_t *data_arg;
  size_t len_arg;
  AssertHelper local_f8;
  Message local_f0;
  Bytes local_e8;
  Bytes local_d8;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_1;
  Message local_b0;
  bool local_a1;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar;
  UniquePtr<uint8_t> scoper;
  undefined1 local_70 [4];
  int ok;
  CBS out;
  CBS in;
  uint8_t *storage;
  ScopedTrace local_31;
  ImplicitStringTest *pIStack_30;
  ScopedTrace gtest_trace_862;
  ImplicitStringTest *test;
  ImplicitStringTest *__end1;
  ImplicitStringTest *__begin1;
  ImplicitStringTest (*__range1) [6];
  CBSTest_ImplicitString_Test *this_local;
  
  for (__end1 = (ImplicitStringTest *)&(anonymous_namespace)::kImplicitStringTests;
      __end1 != (ImplicitStringTest *)
                &testing::internal::TestFactoryImpl<(anonymous_namespace)::CBSTest_ASN1Uint64_Test>
                 ::vtable; __end1 = __end1 + 1) {
    pIStack_30 = __end1;
    Bytes::Bytes((Bytes *)&storage,__end1->in,__end1->in_len);
    testing::ScopedTrace::ScopedTrace<Bytes>
              (&local_31,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x35e,(Bytes *)&storage);
    in.len = 0;
    CBS_init((CBS *)&out.len,(uint8_t *)pIStack_30->in,pIStack_30->in_len);
    iVar2 = CBS_get_asn1_implicit_string
                      ((CBS *)&out.len,(CBS *)local_70,(uint8_t **)&in.len,0x80000000,4);
    std::unique_ptr<unsigned_char,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)&gtest_ar.message_,
               (pointer)in.len);
    local_a1 = iVar2 != 0;
    testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
              ((EqHelper *)local_a0,"test.ok","static_cast<bool>(ok)",&pIStack_30->ok,&local_a1);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
    if (!bVar1) {
      testing::Message::Message(&local_b0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x366,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
    if (iVar2 != 0) {
      Bytes::Bytes(&local_d8,pIStack_30->out,pIStack_30->out_len);
      data_arg = CBS_data((CBS *)local_70);
      len_arg = CBS_len((CBS *)local_70);
      Bytes::Bytes(&local_e8,data_arg,len_arg);
      testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                ((EqHelper *)local_c8,"Bytes(test.out, test.out_len)",
                 "Bytes(CBS_data(&out), CBS_len(&out))",&local_d8,&local_e8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
      if (!bVar1) {
        testing::Message::Message(&local_f0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_f8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x36a,pcVar3);
        testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
        testing::internal::AssertHelper::~AssertHelper(&local_f8);
        testing::Message::~Message(&local_f0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
    }
    std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&gtest_ar.message_);
    testing::ScopedTrace::~ScopedTrace(&local_31);
  }
  return;
}

Assistant:

TEST(CBSTest, ImplicitString) {
  for (const auto &test : kImplicitStringTests) {
    SCOPED_TRACE(Bytes(test.in, test.in_len));
    uint8_t *storage = nullptr;
    CBS in, out;
    CBS_init(&in, reinterpret_cast<const uint8_t *>(test.in), test.in_len);
    int ok = CBS_get_asn1_implicit_string(&in, &out, &storage,
                                          CBS_ASN1_CONTEXT_SPECIFIC | 0,
                                          CBS_ASN1_OCTETSTRING);
    bssl::UniquePtr<uint8_t> scoper(storage);
    EXPECT_EQ(test.ok, static_cast<bool>(ok));

    if (ok) {
      EXPECT_EQ(Bytes(test.out, test.out_len),
                Bytes(CBS_data(&out), CBS_len(&out)));
    }
  }
}